

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DestListHeader.cpp
# Opt level: O2

void __thiscall DestListHeader::printDestListHeaderInHexStyle(DestListHeader *this)

{
  ostream *poVar1;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_a0;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_88;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_70;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_58;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_40;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_28;
  
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "_____________DestListHeader in HEX style________________");
  std::endl<char,std::char_traits<char>>(poVar1);
  std::operator<<((ostream *)&std::cout,"Version:                            ");
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_28,&this->Version);
  Utils::print_vec((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_28);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_28);
  std::operator<<((ostream *)&std::cout,"TotalNumberOfCurrentEntries:        ");
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_40,
             &this->TotalNumberOfCurrentEntries);
  Utils::print_vec((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_40);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_40);
  std::operator<<((ostream *)&std::cout,"TotalNumberOfPinnedEntries:         ");
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_58,
             &this->TotalNumberOfPinnedEntries);
  Utils::print_vec((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_58);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_58);
  std::operator<<((ostream *)&std::cout,"Unknown:                            ");
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_70,&this->Unknown);
  Utils::print_vec((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_70);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_70);
  std::operator<<((ostream *)&std::cout,"LastIssuedEntryId:                  ");
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_88,
             &this->LastIssuedEntryId);
  Utils::print_vec((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_88);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_88);
  std::operator<<((ostream *)&std::cout,"NumberOfAddedDeletedReopened:       ");
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_a0,
             &this->NumberOfAddedDeletedReopened);
  Utils::print_vec((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_a0);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_a0);
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "_________________________________________________________");
  std::endl<char,std::char_traits<char>>(poVar1);
  return;
}

Assistant:

void DestListHeader::printDestListHeaderInHexStyle() {
    cout << "_____________DestListHeader in HEX style________________" << endl;
    cout << "Version:                            "; Utils::print_vec(Version);
    cout << "TotalNumberOfCurrentEntries:        "; Utils::print_vec(TotalNumberOfCurrentEntries);
    cout << "TotalNumberOfPinnedEntries:         "; Utils::print_vec(TotalNumberOfPinnedEntries);
    cout << "Unknown:                            "; Utils::print_vec(Unknown);
    cout << "LastIssuedEntryId:                  "; Utils::print_vec(LastIssuedEntryId);
    cout << "NumberOfAddedDeletedReopened:       "; Utils::print_vec(NumberOfAddedDeletedReopened);
    cout << "_________________________________________________________" << endl;
}